

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

void __thiscall
pstore::small_vector<unsigned_long,_64UL>::small_vector
          (small_vector<unsigned_long,_64UL> *this,size_t required_elements)

{
  array<unsigned_long,_64UL> *__s;
  
  this->elements_ = required_elements;
  __s = &this->small_buffer_;
  memset(__s,0,0x220);
  if (0x40 < required_elements) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->big_buffer_,required_elements);
  }
  if (0x40 < this->elements_) {
    __s = (array<unsigned_long,_64UL> *)
          (this->big_buffer_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start;
  }
  this->buffer_ = __s->_M_elems;
  return;
}

Assistant:

small_vector<ElementType, BodyElements>::small_vector (std::size_t const required_elements)
            : elements_{required_elements} {

        if (!is_small (elements_)) {
            big_buffer_.resize (elements_);
        }
        this->set_buffer_ptr (elements_);
    }